

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void Projection::Initialize(void)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_proj;
  ParmParse pp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  Print *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  ParmParse *in_stack_fffffffffffffb60;
  allocator *os_;
  undefined4 in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffbb8;
  Print *in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbcc;
  double *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  ParmParse *in_stack_fffffffffffffbe0;
  string local_2e0 [32];
  _Self local_2c0;
  _Self local_2b8;
  undefined1 *local_2b0;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [55];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [120];
  char *local_10;
  char *local_8;
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"nodal_proj",&local_89);
    amrex::ParmParse::ParmParse(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(bool *)in_stack_fffffffffffffbd0
               ,in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(bool *)in_stack_fffffffffffffbd0
               ,in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(bool *)in_stack_fffffffffffffbd0
               ,in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(bool *)in_stack_fffffffffffffbd0
               ,in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(bool *)in_stack_fffffffffffffbd0
               ,in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"v",&local_c1);
    iVar2 = amrex::ParmParse::countname
                      ((ParmParse *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (0 < iVar2) {
      local_8 = "nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose";
      amrex::Abort_host((char *)in_stack_fffffffffffffb60);
    }
    os_ = &local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"proj",os_);
    amrex::ParmParse::getEntries(in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x589bbf);
    if (!bVar1) {
      amrex::OutStream();
      amrex::Print::Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffb80),(ostream *)os_);
      amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [75])in_stack_fffffffffffffb48);
      amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [58])in_stack_fffffffffffffb48);
      amrex::Print::~Print(in_stack_fffffffffffffbc0);
      local_2b0 = local_f8;
      local_2b8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb48);
      local_2c0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb48);
      while (bVar1 = std::operator!=(&local_2b8,&local_2c0), bVar1) {
        pbVar3 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffb50);
        std::__cxx11::string::string(local_2e0,(string *)pbVar3);
        in_stack_fffffffffffffb60 = (ParmParse *)amrex::OutStream();
        amrex::Print::Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffb80),(ostream *)os_);
        amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [3])in_stack_fffffffffffffb48);
        in_stack_fffffffffffffb50 =
             amrex::Print::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [2])in_stack_fffffffffffffb48);
        amrex::Print::~Print(in_stack_fffffffffffffbc0);
        std::__cxx11::string::~string(local_2e0);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffb50);
      }
      local_10 = "Replace \'proj\' prefix with \'nodal_proj\' in inputs";
      amrex::Abort_host((char *)in_stack_fffffffffffffb60);
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x589e1c);
    (anonymous_namespace)::initialized = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x589e32);
    amrex::ParmParse::~ParmParse((ParmParse *)0x589e3f);
  }
  return;
}

Assistant:

void
Projection::Initialize ()
{
    if (initialized) return;

    ParmParse pp("nodal_proj");

    pp.query("verbose",             verbose);
    pp.query("proj_tol",            proj_tol);
    pp.query("sync_tol",            sync_tol);
    pp.query("proj_abs_tol",        proj_abs_tol);
    pp.query("benchmarking",        benchmarking);
    pp.query("add_vort_proj",       add_vort_proj);
    pp.query("do_outflow_bcs",      do_outflow_bcs);
    pp.query("rho_wgt_vel_proj",    rho_wgt_vel_proj);

    pp.query("agglomeration",       agglomeration);
    pp.query("consolidation",       consolidation);
    pp.query("max_fmg_iter",        max_fmg_iter);
    pp.query("use_gauss_seidel",    use_gauss_seidel);
    pp.query("use_harmonic_average", use_harmonic_average);
    pp.query("mg_max_coarsening_level", max_coarsening_level);


    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose");
    }
    // Abort if old "proj." prefix is used.
    std::set<std::string> old_proj = ParmParse::getEntries("proj");
    if (!old_proj.empty()){
	Print()<<"All runtime options related to the nodal projection now use 'nodal_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_proj ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'proj' prefix with 'nodal_proj' in inputs");
    }
	
    amrex::ExecOnFinalize(Projection::Finalize);

    initialized = true;
}